

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O0

base_learner * cb_algs_setup(options_i *options,vw *all)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  ostream *this;
  pointer pcVar5;
  base_learner *this_00;
  single_learner *base_00;
  long in_RSI;
  long *in_RDI;
  learner<CB_ALGS::cb,_example> *l;
  single_learner *base;
  stringstream ss;
  stringstream __msg;
  size_t problem_multiplier;
  cb_to_cs *c;
  option_group_definition new_options;
  bool eval;
  string type_string;
  free_ptr<CB_ALGS::cb> data;
  undefined4 in_stack_fffffffffffff528;
  prediction_type_t in_stack_fffffffffffff52c;
  vw *in_stack_fffffffffffff530;
  string *in_stack_fffffffffffff538;
  learner<CB_ALGS::cb,_example> *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff548;
  undefined8 in_stack_fffffffffffff550;
  char *in_stack_fffffffffffff558;
  vw_exception *in_stack_fffffffffffff560;
  allocator *paVar6;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff578;
  long *plVar7;
  option_group_definition *in_stack_fffffffffffff580;
  learner<CB_ALGS::cb,_example> *local_9b0;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [32];
  stringstream local_958 [16];
  undefined1 local_948 [56];
  learner<char,_char> *in_stack_fffffffffffff6f0;
  allocator local_7c9;
  string local_7c8 [39];
  undefined1 local_7a1;
  stringstream local_780 [16];
  ostream local_770;
  undefined8 local_5f8;
  pointer local_5f0;
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [32];
  undefined4 local_598;
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [359];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390 [2];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  typed_option<unsigned_int> local_200 [2];
  allocator local_b9;
  string local_b8 [32];
  undefined1 local_98 [59];
  byte local_5d;
  allocator local_49;
  string local_48 [48];
  long local_18;
  long *local_10;
  vw *local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff550 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<CB_ALGS::cb>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"dr",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_5d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Contextual Bandit Options",&local_b9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff530,
             (string *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"cb",&local_221);
  std::unique_ptr<CB_ALGS::cb,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_ALGS::cb,_void_(*)(void_*)> *)0x396780);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff538,(uint *)in_stack_fffffffffffff530)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_200,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"Use contextual bandit learning with <k> costs",&local_249)
  ;
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530,
             (string *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff580,(typed_option<unsigned_int> *)in_stack_fffffffffffff578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"cb_type",&local_3b1);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff538,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_390,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3d8,"contextual bandit method to use in {ips,dm,dr}",&local_3d9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff530,
       (string *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff530,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"eval",&local_541);
  VW::config::make_option<bool>(in_stack_fffffffffffff538,(bool *)in_stack_fffffffffffff530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"Evaluate a policy rather than optimizing.",&local_569);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff530,
             (string *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff530,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff580,(typed_option<bool> *)in_stack_fffffffffffff578);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  (**(code **)*local_10)(local_10,local_98);
  plVar7 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"cb",&local_591);
  bVar1 = (**(code **)(*plVar7 + 8))(plVar7,local_590);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  plVar7 = local_10;
  if (((bVar1 ^ 0xff) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5b8,"cb_type",&local_5b9);
    bVar1 = (**(code **)(*plVar7 + 8))(plVar7,local_5b8);
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    plVar7 = local_10;
    if (((bVar1 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e0,"cb_type",&local_5e1);
      (**(code **)(*plVar7 + 0x28))(plVar7,local_5e0,local_48);
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      (**(code **)*local_10)(local_10,local_98);
    }
    local_5f0 = std::unique_ptr<CB_ALGS::cb,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_ALGS::cb,_void_(*)(void_*)> *)0x3970f5);
    local_5f8 = 2;
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if (iVar2 == 0) {
      (local_5f0->cbcs).cb_type = 0;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_48);
      if (iVar2 == 0) {
        if ((local_5d & 1) != 0) {
          std::__cxx11::stringstream::stringstream(local_780);
          std::operator<<(&local_770,
                          "direct method can not be used for evaluation --- it is biased.");
          local_7a1 = 1;
          uVar4 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffff560,in_stack_fffffffffffff558,iVar3,
                     in_stack_fffffffffffff548);
          local_7a1 = 0;
          __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        (local_5f0->cbcs).cb_type = 1;
        local_5f8 = 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_48);
        if (iVar3 == 0) {
          (local_5f0->cbcs).cb_type = 2;
          local_5f8 = 1;
        }
        else {
          this = std::operator<<((ostream *)&std::cerr,
                                 "warning: cb_type must be in {\'ips\',\'dm\',\'dr\'}; resetting to dr."
                                );
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          (local_5f0->cbcs).cb_type = 0;
        }
      }
    }
    paVar6 = &local_7c9;
    plVar7 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c8,"csoaa",paVar6);
    bVar1 = (**(code **)(*plVar7 + 8))(plVar7,local_7c8);
    std::__cxx11::string::~string(local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_958);
      pcVar5 = std::unique_ptr<CB_ALGS::cb,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_ALGS::cb,_void_(*)(void_*)> *)0x3973b3);
      std::ostream::operator<<(local_948,(pcVar5->cbcs).num_actions);
      paVar6 = &local_979;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_978,"csoaa",paVar6);
      std::__cxx11::stringstream::str();
      (**(code **)(*local_10 + 0x28))(local_10,local_978,local_9a0);
      std::__cxx11::string::~string(local_9a0);
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      std::__cxx11::stringstream::~stringstream(local_958);
    }
    this_00 = setup_base((options_i *)in_stack_fffffffffffff538,in_stack_fffffffffffff530);
    base_00 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff6f0);
    if ((local_5d & 1) == 0) {
      memcpy((void *)(*(long *)(local_18 + 8) + 0x330),&CB::cb_label,0x48);
      *(undefined4 *)(local_18 + 0x3650) = 1;
    }
    else {
      memcpy((void *)(*(long *)(local_18 + 8) + 0x330),CB_EVAL::cb_eval,0x48);
      *(undefined4 *)(local_18 + 0x3650) = 2;
    }
    if ((local_5d & 1) == 0) {
      local_9b0 = LEARNER::init_learner<CB_ALGS::cb,example,LEARNER::learner<char,example>>
                            ((free_ptr<CB_ALGS::cb> *)this_00,base_00,
                             (_func_void_cb_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff540,
                             (_func_void_cb_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530,
                             in_stack_fffffffffffff52c);
      LEARNER::learner<CB_ALGS::cb,_example>::set_finish_example(local_9b0,CB_ALGS::finish_example);
    }
    else {
      local_9b0 = LEARNER::init_learner<CB_ALGS::cb,example,LEARNER::learner<char,example>>
                            ((free_ptr<CB_ALGS::cb> *)this_00,base_00,
                             (_func_void_cb_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff540,
                             (_func_void_cb_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff538,(size_t)in_stack_fffffffffffff530,
                             in_stack_fffffffffffff52c);
      in_stack_fffffffffffff540 = local_9b0;
      LEARNER::learner<CB_ALGS::cb,_example>::set_finish_example
                (local_9b0,CB_ALGS::eval_finish_example);
    }
    (local_5f0->cbcs).scorer = *(single_learner **)(local_18 + 0x30);
    LEARNER::learner<CB_ALGS::cb,_example>::set_finish
              ((learner<CB_ALGS::cb,_example> *)this_00,(_func_void_cb_ptr *)base_00);
    in_stack_fffffffffffff530 = (vw *)LEARNER::make_base<CB_ALGS::cb,example>(local_9b0);
    local_8 = in_stack_fffffffffffff530;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_598 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<CB_ALGS::cb,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CB_ALGS::cb,_void_(*)(void_*)> *)in_stack_fffffffffffff540);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cb_algs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb>();
  std::string type_string = "dr";
  bool eval = false;

  option_group_definition new_options("Contextual Bandit Options");
  new_options
      .add(make_option("cb", data->cbcs.num_actions).keep().help("Use contextual bandit learning with <k> costs"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr}"))
      .add(make_option("eval", eval).help("Evaluate a policy rather than optimizing."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb"))
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  cb_to_cs& c = data->cbcs;

  size_t problem_multiplier = 2;  // default for DR
  if (type_string.compare("dr") == 0)
    c.cb_type = CB_TYPE_DR;
  else if (type_string.compare("dm") == 0)
  {
    if (eval)
      THROW("direct method can not be used for evaluation --- it is biased.");
    c.cb_type = CB_TYPE_DM;
    problem_multiplier = 1;
  }
  else if (type_string.compare("ips") == 0)
  {
    c.cb_type = CB_TYPE_IPS;
    problem_multiplier = 1;
  }
  else
  {
    std::cerr << "warning: cb_type must be in {'ips','dm','dr'}; resetting to dr." << std::endl;
    c.cb_type = CB_TYPE_DR;
  }

  if (!options.was_supplied("csoaa"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("csoaa", ss.str());
  }

  auto base = as_singleline(setup_base(options, all));
  if (eval)
  {
    all.p->lp = CB_EVAL::cb_eval;
    all.label_type = label_type::cb_eval;
  }
  else
  {
    all.p->lp = CB::cb_label;
    all.label_type = label_type::cb;
  }

  learner<cb, example>* l;
  if (eval)
  {
    l = &init_learner(data, base, learn_eval, predict_eval, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(eval_finish_example);
  }
  else
  {
    l = &init_learner(
        data, base, predict_or_learn<true>, predict_or_learn<false>, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(finish_example);
  }
  c.scorer = all.scorer;

  l->set_finish(finish);
  return make_base(*l);
}